

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeinApi.c
# Opt level: O3

void skeinReset(SkeinCtx_t *ctx)

{
  memcpy((void *)((long)&ctx->m + 0x20),ctx->XSave,ctx->skeinSize >> 3);
  (ctx->m).h.T[1] = 0x7000000000000000;
  (ctx->m).h.bCnt = 0;
  (ctx->m).h.T[0] = 0;
  return;
}

Assistant:

void skeinReset(SkeinCtx_t* ctx)
{
    size_t Xlen = 0;
    u64b_t*  X = NULL;

    /*
     * The following two lines rely of the fact that the real Skein contexts are
     * a union in out context and thus have tha maximum memory available.
     * The beautiy of C :-) .
     */
    X = ctx->m.s256.X;
    Xlen = ctx->skeinSize/8;
    /* Restore the chaing variable, reset byte counter */
    memcpy(X, ctx->XSave, Xlen);

    /* Setup context to process the message */
    Skein_Start_New_Type(&ctx->m, MSG);
}